

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestTest.cpp
# Opt level: O2

void __thiscall
ManifestTest_normalize_path_bad_working_directory_Test::
ManifestTest_normalize_path_bad_working_directory_Test
          (ManifestTest_normalize_path_bad_working_directory_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001c1978;
  return;
}

Assistant:

TEST(ManifestTest, normalize_path_bad_working_directory) {
  EXPECT_EQ(normalize("", ""), "<failed to normalize>");
  EXPECT_EQ(normalize("k", ""), "<failed to normalize>");
  EXPECT_EQ(normalize(".", ""), "<failed to normalize>");
  EXPECT_EQ(normalize("..", ""), "<failed to normalize>");
  EXPECT_EQ(normalize("/", ""), "/");

  EXPECT_EQ(normalize("", "k"), "<failed to normalize>");
  EXPECT_EQ(normalize("k", "k"), "<failed to normalize>");
  EXPECT_EQ(normalize("..", "k"), "<failed to normalize>");
  EXPECT_EQ(normalize("/", "k"), "/k");

  EXPECT_EQ(normalize("", "."), "<failed to normalize>");
  EXPECT_EQ(normalize("k", "."), "<failed to normalize>");
  EXPECT_EQ(normalize("..", "."), "<failed to normalize>");
  EXPECT_EQ(normalize("/", "."), "/");

  EXPECT_EQ(normalize("", ".."), "<failed to normalize>");
  EXPECT_EQ(normalize("k", ".."), "<failed to normalize>");
  EXPECT_EQ(normalize("..", ".."), "<failed to normalize>");
  EXPECT_EQ(normalize("/", ".."), "/");
}